

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenshtein.cpp
# Opt level: O2

void duckdb::LevenshteinFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  long *plVar3;
  undefined8 *puVar4;
  reference vector;
  reference vector_00;
  long lVar5;
  long lVar6;
  long lVar7;
  UnifiedVectorFormat *pUVar8;
  long lVar9;
  UnifiedVectorFormat *pUVar10;
  ulong uVar11;
  idx_t i;
  VectorType VVar12;
  undefined8 in_R8;
  ValidityMask *in_R9;
  UnifiedVectorFormat *pUVar13;
  undefined8 *puVar14;
  UnifiedVectorFormat *pUVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  idx_t i_1;
  bool bVar19;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t left_07;
  string_t left_08;
  string_t left_09;
  string_t left_10;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  string_t right_07;
  string_t right_08;
  string_t right_09;
  string_t right_10;
  idx_t in_stack_ffffffffffffff08;
  idx_t iVar20;
  long *local_c0;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat ldata;
  long local_70;
  long local_68;
  
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar12 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar12);
    plVar3 = *(long **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      left.value.pointer.ptr = (char *)**(undefined8 **)(vector_00 + 0x20);
      left.value._0_8_ = (*(undefined8 **)(vector + 0x20))[1];
      right.value.pointer.ptr = (char *)in_R8;
      right.value._0_8_ = (*(undefined8 **)(vector_00 + 0x20))[1];
      lVar5 = BinaryLambdaWrapper::
              Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                        ((Vector *)**(undefined8 **)(vector + 0x20),left,right,in_R9,
                         in_stack_ffffffffffffff08);
      *plVar3 = lVar5;
      return;
    }
  }
  else {
    pUVar15 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      lVar5 = *(long *)(vector + 0x20);
      puVar4 = *(undefined8 **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar12);
        iVar20 = *(idx_t *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          puVar14 = (undefined8 *)(lVar5 + 8);
          for (pUVar13 = (UnifiedVectorFormat *)0x0; pUVar15 != pUVar13; pUVar13 = pUVar13 + 1) {
            left_05.value.pointer.ptr = (char *)*puVar4;
            left_05.value._0_8_ = *puVar14;
            right_05.value.pointer.ptr = (char *)in_R8;
            right_05.value._0_8_ = puVar4[1];
            lVar5 = BinaryLambdaWrapper::
                    Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                              ((Vector *)puVar14[-1],left_05,right_05,in_R9,iVar20);
            *(long *)(iVar20 + (long)pUVar13 * 8) = lVar5;
            puVar14 = puVar14 + 2;
          }
          return;
        }
        lVar5 = lVar5 + 8;
        uVar11 = 0;
        pUVar13 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar11 == (ulong)(pUVar15 + 0x3f) >> 6) {
            return;
          }
          if (*(long *)(result + 0x28) == 0) {
            pUVar8 = pUVar13 + 0x40;
            if (pUVar15 <= pUVar13 + 0x40) {
              pUVar8 = pUVar15;
            }
LAB_0079932d:
            puVar14 = (undefined8 *)((long)pUVar13 * 0x10 + lVar5);
            for (; pUVar10 = pUVar13, pUVar13 < pUVar8; pUVar13 = pUVar13 + 1) {
              left_00.value.pointer.ptr = (char *)*puVar4;
              left_00.value._0_8_ = *puVar14;
              right_00.value.pointer.ptr = (char *)in_R8;
              right_00.value._0_8_ = puVar4[1];
              lVar6 = BinaryLambdaWrapper::
                      Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                ((Vector *)puVar14[-1],left_00,right_00,in_R9,iVar20);
              *(long *)(iVar20 + (long)pUVar13 * 8) = lVar6;
              puVar14 = puVar14 + 2;
            }
          }
          else {
            uVar17 = *(ulong *)(*(long *)(result + 0x28) + uVar11 * 8);
            pUVar8 = pUVar13 + 0x40;
            if (pUVar15 <= pUVar13 + 0x40) {
              pUVar8 = pUVar15;
            }
            if (uVar17 == 0xffffffffffffffff) goto LAB_0079932d;
            pUVar10 = pUVar8;
            if (uVar17 != 0) {
              lVar6 = iVar20 + (long)pUVar13 * 8;
              puVar14 = (undefined8 *)((long)pUVar13 * 0x10 + lVar5);
              for (uVar16 = 0; pUVar10 = pUVar13 + uVar16, pUVar13 + uVar16 < pUVar8;
                  uVar16 = uVar16 + 1) {
                if ((uVar17 >> (uVar16 & 0x3f) & 1) != 0) {
                  left_01.value.pointer.ptr = (char *)*puVar4;
                  left_01.value._0_8_ = *puVar14;
                  right_01.value.pointer.ptr = (char *)in_R8;
                  right_01.value._0_8_ = puVar4[1];
                  lVar7 = BinaryLambdaWrapper::
                          Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                    ((Vector *)puVar14[-1],left_01,right_01,in_R9,iVar20);
                  *(long *)(lVar6 + uVar16 * 8) = lVar7;
                }
                puVar14 = puVar14 + 2;
              }
            }
          }
          uVar11 = uVar11 + 1;
          pUVar13 = pUVar10;
        } while( true );
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar5 = *(long *)(vector + 0x20);
          lVar6 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar12);
          iVar20 = *(idx_t *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            lVar7 = 0;
            while (bVar19 = pUVar15 != (UnifiedVectorFormat *)0x0, pUVar15 = pUVar15 + -1, bVar19) {
              left_10.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + lVar7 * 2);
              left_10.value._0_8_ = *(undefined8 *)(lVar5 + 8 + lVar7 * 2);
              right_10.value.pointer.ptr = (char *)in_R8;
              right_10.value._0_8_ = *(undefined8 *)(lVar6 + 8 + lVar7 * 2);
              lVar9 = BinaryLambdaWrapper::
                      Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                (*(Vector **)(lVar5 + lVar7 * 2),left_10,right_10,in_R9,iVar20);
              *(long *)(iVar20 + lVar7) = lVar9;
              lVar7 = lVar7 + 8;
            }
          }
          else {
            pUVar13 = (UnifiedVectorFormat *)0x0;
            for (uVar11 = 0; uVar11 != (ulong)(pUVar15 + 0x3f) >> 6; uVar11 = uVar11 + 1) {
              lVar7 = *(long *)(result + 0x28);
              if (lVar7 == 0) {
                pUVar8 = pUVar13 + 0x40;
                if (pUVar15 <= pUVar13 + 0x40) {
                  pUVar8 = pUVar15;
                }
LAB_0079977d:
                uVar17 = (long)pUVar13 << 4 | 8;
                for (; pUVar10 = pUVar13, pUVar13 < pUVar8; pUVar13 = pUVar13 + 1) {
                  left_06.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + -8 + uVar17);
                  left_06.value._0_8_ = *(undefined8 *)(lVar5 + uVar17);
                  right_06.value.pointer.ptr = (char *)in_R8;
                  right_06.value._0_8_ = *(undefined8 *)(lVar6 + uVar17);
                  lVar7 = BinaryLambdaWrapper::
                          Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                    (*(Vector **)(lVar5 + -8 + uVar17),left_06,right_06,in_R9,iVar20
                                    );
                  *(long *)(iVar20 + (long)pUVar13 * 8) = lVar7;
                  uVar17 = uVar17 + 0x10;
                }
              }
              else {
                uVar17 = *(ulong *)(lVar7 + uVar11 * 8);
                pUVar8 = pUVar13 + 0x40;
                if (pUVar15 <= pUVar13 + 0x40) {
                  pUVar8 = pUVar15;
                }
                if (uVar17 == 0xffffffffffffffff) goto LAB_0079977d;
                pUVar10 = pUVar8;
                if (uVar17 != 0) {
                  lVar7 = iVar20 + (long)pUVar13 * 8;
                  uVar18 = (long)pUVar13 << 4 | 8;
                  for (uVar16 = 0; pUVar10 = pUVar13 + uVar16, pUVar13 + uVar16 < pUVar8;
                      uVar16 = uVar16 + 1) {
                    if ((uVar17 >> (uVar16 & 0x3f) & 1) != 0) {
                      left_07.value.pointer.ptr = (char *)*(undefined8 *)(lVar6 + -8 + uVar18);
                      left_07.value._0_8_ = *(undefined8 *)(lVar5 + uVar18);
                      right_07.value.pointer.ptr = (char *)in_R8;
                      right_07.value._0_8_ = *(undefined8 *)(lVar6 + uVar18);
                      lVar9 = BinaryLambdaWrapper::
                              Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                        (*(Vector **)(lVar5 + -8 + uVar18),left_07,right_07,in_R9,
                                         iVar20);
                      *(long *)(lVar7 + uVar16 * 8) = lVar9;
                    }
                    uVar18 = uVar18 + 0x10;
                  }
                }
              }
              pUVar13 = pUVar10;
            }
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,pUVar15);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,pUVar15);
          duckdb::Vector::SetVectorType(VVar12);
          iVar20 = *(idx_t *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            for (pUVar13 = (UnifiedVectorFormat *)0x0; pUVar15 != pUVar13; pUVar13 = pUVar13 + 1) {
              pUVar8 = pUVar13;
              if (*_ldata != 0) {
                pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar13 * 4);
              }
              pUVar10 = pUVar13;
              if (*local_c0 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar13 * 4);
              }
              left_02.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar10 * 0x10);
              left_02.value._0_8_ = *(undefined8 *)(local_70 + 8 + (long)pUVar8 * 0x10);
              right_02.value.pointer.ptr = (char *)in_R8;
              right_02.value._0_8_ = *(undefined8 *)(local_b8 + 8 + (long)pUVar10 * 0x10);
              lVar5 = BinaryLambdaWrapper::
                      Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                (*(Vector **)(local_70 + (long)pUVar8 * 0x10),left_02,right_02,in_R9
                                 ,iVar20);
              *(long *)(iVar20 + (long)pUVar13 * 8) = lVar5;
            }
          }
          else {
            for (pUVar13 = (UnifiedVectorFormat *)0x0; pUVar15 != pUVar13; pUVar13 = pUVar13 + 1) {
              pUVar8 = pUVar13;
              if (*_ldata != 0) {
                pUVar8 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar13 * 4);
              }
              pUVar10 = pUVar13;
              if (*local_c0 != 0) {
                pUVar10 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar13 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar8 >> 6) * 8) >> ((ulong)pUVar8 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar10 >> 6) * 8) >> ((ulong)pUVar10 & 0x3f) & 1)
                   != 0)))) {
                left_08.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + (long)pUVar10 * 0x10)
                ;
                left_08.value._0_8_ = *(undefined8 *)(local_70 + 8 + (long)pUVar8 * 0x10);
                right_08.value.pointer.ptr = (char *)in_R8;
                right_08.value._0_8_ = *(undefined8 *)(local_b8 + 8 + (long)pUVar10 * 0x10);
                lVar5 = BinaryLambdaWrapper::
                        Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                  (*(Vector **)(local_70 + (long)pUVar8 * 0x10),left_08,right_08,
                                   in_R9,iVar20);
                *(long *)(iVar20 + (long)pUVar13 * 8) = lVar5;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar13);
              }
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      puVar4 = *(undefined8 **)(vector + 0x20);
      lVar5 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar12);
        iVar20 = *(idx_t *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,(ValidityMask *)(vector_00 + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          puVar14 = (undefined8 *)(lVar5 + 8);
          for (pUVar13 = (UnifiedVectorFormat *)0x0; pUVar15 != pUVar13; pUVar13 = pUVar13 + 1) {
            left_09.value.pointer.ptr = (char *)puVar14[-1];
            left_09.value._0_8_ = puVar4[1];
            right_09.value.pointer.ptr = (char *)in_R8;
            right_09.value._0_8_ = *puVar14;
            lVar5 = BinaryLambdaWrapper::
                    Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                              ((Vector *)*puVar4,left_09,right_09,in_R9,iVar20);
            *(long *)(iVar20 + (long)pUVar13 * 8) = lVar5;
            puVar14 = puVar14 + 2;
          }
          return;
        }
        lVar5 = lVar5 + 8;
        uVar11 = 0;
        pUVar13 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar11 == (ulong)(pUVar15 + 0x3f) >> 6) {
            return;
          }
          if (*(long *)(result + 0x28) == 0) {
            pUVar8 = pUVar13 + 0x40;
            if (pUVar15 <= pUVar13 + 0x40) {
              pUVar8 = pUVar15;
            }
LAB_007995bf:
            puVar14 = (undefined8 *)((long)pUVar13 * 0x10 + lVar5);
            for (; pUVar10 = pUVar13, pUVar13 < pUVar8; pUVar13 = pUVar13 + 1) {
              left_03.value.pointer.ptr = (char *)puVar14[-1];
              left_03.value._0_8_ = puVar4[1];
              right_03.value.pointer.ptr = (char *)in_R8;
              right_03.value._0_8_ = *puVar14;
              lVar6 = BinaryLambdaWrapper::
                      Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                ((Vector *)*puVar4,left_03,right_03,in_R9,iVar20);
              *(long *)(iVar20 + (long)pUVar13 * 8) = lVar6;
              puVar14 = puVar14 + 2;
            }
          }
          else {
            uVar17 = *(ulong *)(*(long *)(result + 0x28) + uVar11 * 8);
            pUVar8 = pUVar13 + 0x40;
            if (pUVar15 <= pUVar13 + 0x40) {
              pUVar8 = pUVar15;
            }
            if (uVar17 == 0xffffffffffffffff) goto LAB_007995bf;
            pUVar10 = pUVar8;
            if (uVar17 != 0) {
              lVar6 = iVar20 + (long)pUVar13 * 8;
              puVar14 = (undefined8 *)((long)pUVar13 * 0x10 + lVar5);
              for (uVar16 = 0; pUVar10 = pUVar13 + uVar16, pUVar13 + uVar16 < pUVar8;
                  uVar16 = uVar16 + 1) {
                if ((uVar17 >> (uVar16 & 0x3f) & 1) != 0) {
                  left_04.value.pointer.ptr = (char *)puVar14[-1];
                  left_04.value._0_8_ = puVar4[1];
                  right_04.value.pointer.ptr = (char *)in_R8;
                  right_04.value._0_8_ = *puVar14;
                  lVar7 = BinaryLambdaWrapper::
                          Operation<duckdb::LevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
                                    ((Vector *)*puVar4,left_04,right_04,in_R9,iVar20);
                  *(long *)(lVar6 + uVar16 * 8) = lVar7;
                }
                puVar14 = puVar14 + 2;
              }
            }
          }
          uVar11 = uVar11 + 1;
          pUVar13 = pUVar10;
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar12);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void LevenshteinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &str_vec = args.data[0];
	auto &tgt_vec = args.data[1];

	BinaryExecutor::Execute<string_t, string_t, int64_t>(
	    str_vec, tgt_vec, result, args.size(),
	    [&](string_t str, string_t tgt) { return LevenshteinScalarFunction(result, str, tgt); });
}